

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwbase.h
# Opt level: O0

Quat rw::Quat::rotation(float32 angle,V3d *axis)

{
  float w;
  float r;
  Quat QVar1;
  V3d VVar2;
  V3d local_58;
  V3d local_48;
  V3d local_38;
  V3d *local_28;
  V3d *axis_local;
  float32 angle_local;
  
  local_28 = axis;
  axis_local._4_4_ = angle;
  w = cosf((float)angle * 0.5);
  VVar2 = normalize(local_28);
  local_58.z = VVar2.z;
  local_48.z = local_58.z;
  local_58._0_8_ = VVar2._0_8_;
  local_48.x = local_58.x;
  local_48.y = local_58.y;
  r = sinf((float)axis_local._4_4_ * 0.5);
  VVar2 = scale(&local_48,(float32)r);
  local_38.z = VVar2.z;
  local_38._0_8_ = VVar2._0_8_;
  QVar1 = makeQuat((float32)w,&local_38);
  return QVar1;
}

Assistant:

static Quat rotation(float32 angle, const V3d &axis){
		return makeQuat(cosf(angle/2.0f), scale(normalize(axis), sinf(angle/2.0f))); }